

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_oset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  OBJ_DATA *pOVar3;
  char *in_RSI;
  int value;
  OBJ_DATA *obj;
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffc9d8;
  undefined4 in_stack_ffffffffffffc9dc;
  char *in_stack_ffffffffffffc9e0;
  char in_stack_ffffffffffffc9e8;
  undefined7 in_stack_ffffffffffffc9e9;
  char *in_stack_ffffffffffffc9f0;
  char *in_stack_ffffffffffffca00;
  char *in_stack_ffffffffffffca08;
  char *in_stack_ffffffffffffdbe0;
  char in_stack_ffffffffffffdbe8;
  undefined7 in_stack_ffffffffffffdbe9;
  char local_1218;
  char *in_stack_ffffffffffffffe8;
  
  smash_tilde(in_RSI);
  one_argument(in_stack_ffffffffffffc9e0,
               (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  ch_00 = (CHAR_DATA *)
          one_argument(in_stack_ffffffffffffc9e0,
                       (char *)CONCAT44(in_stack_ffffffffffffc9dc,in_stack_ffffffffffffc9d8));
  strcpy(&stack0xffffffffffffc9e8,(char *)ch_00);
  if (((local_1218 == '\0') || (in_stack_ffffffffffffdbe8 == '\0')) ||
     (in_stack_ffffffffffffc9e8 == '\0')) {
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    send_to_char(in_stack_ffffffffffffc9f0,
                 (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
  }
  else {
    pOVar3 = get_obj_world((CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffdbe9,in_stack_ffffffffffffdbe8),
                           in_stack_ffffffffffffdbe0);
    if (pOVar3 == (OBJ_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffc9f0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffc9e9,in_stack_ffffffffffffc9e8));
    }
    else {
      iVar2 = atoi(&stack0xffffffffffffc9e8);
      bVar1 = str_cmp(&stack0xffffffffffffdbe8,"value0");
      if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffdbe8,"v0"), bVar1)) {
        bVar1 = str_cmp(&stack0xffffffffffffdbe8,"value1");
        if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffdbe8,"v1"), bVar1)) {
          bVar1 = str_cmp(&stack0xffffffffffffdbe8,"value2");
          if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffdbe8,"v2"), bVar1)) {
            bVar1 = str_cmp(&stack0xffffffffffffdbe8,"value3");
            if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffdbe8,"v3"), bVar1)) {
              bVar1 = str_cmp(&stack0xffffffffffffdbe8,"value4");
              if ((bVar1) && (bVar1 = str_cmp(&stack0xffffffffffffdbe8,"v4"), bVar1)) {
                bVar1 = str_prefix(in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
                if (bVar1) {
                  bVar1 = str_prefix(in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
                  if (bVar1) {
                    bVar1 = str_prefix(in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
                    if (bVar1) {
                      bVar1 = str_prefix(in_stack_ffffffffffffca08,in_stack_ffffffffffffca00);
                      if (bVar1) {
                        do_oset(ch_00,in_stack_ffffffffffffffe8);
                      }
                      else {
                        pOVar3->timer = (short)iVar2;
                      }
                    }
                    else {
                      pOVar3->cost = iVar2;
                    }
                  }
                  else {
                    pOVar3->weight = (short)iVar2;
                  }
                }
                else {
                  pOVar3->level = (short)iVar2;
                }
              }
              else {
                pOVar3->value[4] = iVar2;
              }
            }
            else {
              pOVar3->value[3] = iVar2;
            }
          }
          else {
            pOVar3->value[2] = iVar2;
          }
        }
        else {
          pOVar3->value[1] = iVar2;
        }
      }
      else {
        pOVar3->value[0] = iVar2;
      }
    }
  }
  return;
}

Assistant:

void do_oset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	OBJ_DATA *obj;
	int value;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set obj <object> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    value0 value1 value2 value3 value4 (v1-v4)\n\r", ch);
		send_to_char("    extra wear level weight cost timer\n\r", ch);
		return;
	}

	obj = get_obj_world(ch, arg1);

	if (obj == nullptr)
	{
		send_to_char("Nothing like that in heaven or earth.\n\r", ch);
		return;
	}

	/*
	 * Snarf the value (which need not be numeric).
	 */
	value = atoi(arg3);

	/*
	 * Set something.
	 */
	if (!str_cmp(arg2, "value0") || !str_cmp(arg2, "v0"))
	{
		/*	obj->value[0] = std::min(50,value); */
		obj->value[0] = value;
		return;
	}

	if (!str_cmp(arg2, "value1") || !str_cmp(arg2, "v1"))
	{
		obj->value[1] = value;
		return;
	}

	if (!str_cmp(arg2, "value2") || !str_cmp(arg2, "v2"))
	{
		obj->value[2] = value;
		return;
	}

	if (!str_cmp(arg2, "value3") || !str_cmp(arg2, "v3"))
	{
		obj->value[3] = value;
		return;
	}

	if (!str_cmp(arg2, "value4") || !str_cmp(arg2, "v4"))
	{
		obj->value[4] = value;
		return;
	}

	if (!str_prefix(arg2, "level"))
	{
		obj->level = value;
		return;
	}

	if (!str_prefix(arg2, "weight"))
	{
		obj->weight = value;
		return;
	}

	if (!str_prefix(arg2, "cost"))
	{
		obj->cost = value;
		return;
	}

	if (!str_prefix(arg2, "timer"))
	{
		obj->timer = value;
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_oset(ch, "");
}